

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

InstrUID decode(OpcodeType type,InstructionContext insnContext,uint8_t opcode,uint8_t modRM)

{
  uint8_t index;
  uint8_t *indextable;
  ModRMDecision *dec;
  uint8_t modRM_local;
  uint8_t opcode_local;
  InstructionContext insnContext_local;
  OpcodeType type_local;
  
  switch(type) {
  default:
    if ("\x01\x02\x03\x04"[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerOneByteOpcodes[(int)("\x01\x02\x03\x04"[insnContext] - 1)].
                    modRMDecisions[opcode].modrm_type;
    }
    break;
  case TWOBYTE:
    if ("\x01\x02\x03\x04"[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerTwoByteOpcodes[(int)("\x01\x02\x03\x04"[insnContext] - 1)].
                    modRMDecisions[opcode].modrm_type;
    }
    break;
  case THREEBYTE_38:
    if ("\x01\x02\x03\x04"[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerThreeByte38Opcodes[(int)("\x01\x02\x03\x04"[insnContext] - 1)].
                    modRMDecisions[opcode].modrm_type;
    }
    break;
  case THREEBYTE_3A:
    if ("\x01\x02\x03\x04"[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerThreeByte3AOpcodes[(int)("\x01\x02\x03\x04"[insnContext] - 1)].
                    modRMDecisions[opcode].modrm_type;
    }
    break;
  case XOP8_MAP:
    if (""[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerXOP8Opcodes[(int)(""[insnContext] - 1)].modRMDecisions[opcode].
                    modrm_type;
    }
    break;
  case XOP9_MAP:
    if (""[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerXOP9Opcodes[(int)(""[insnContext] - 1)].modRMDecisions[opcode].
                    modrm_type;
    }
    break;
  case XOPA_MAP:
    if (""[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerXOPAOpcodes[(int)(""[insnContext] - 1)].modRMDecisions[opcode].
                    modrm_type;
    }
    break;
  case T3DNOW_MAP:
    if ("\x01\x02\x03\x04\x05\x06\a"[insnContext] == 0) {
      indextable = &emptyTable.modRMDecisions[opcode].modrm_type;
    }
    else {
      indextable = &x86DisassemblerT3DNOWOpcodes
                    [(int)("\x01\x02\x03\x04\x05\x06\a"[insnContext] - 1)].modRMDecisions[opcode].
                    modrm_type;
    }
  }
  switch(*indextable) {
  case '\0':
    insnContext_local._2_2_ = modRMTable[*(ushort *)(indextable + 2)];
    break;
  case '\x01':
    if ((int)(modRM & 0xc0) >> 6 == 3) {
      insnContext_local._2_2_ = modRMTable[(int)(*(ushort *)(indextable + 2) + 1)];
    }
    else {
      insnContext_local._2_2_ = modRMTable[*(ushort *)(indextable + 2)];
    }
    break;
  case '\x02':
    if ((int)(modRM & 0xc0) >> 6 == 3) {
      insnContext_local._2_2_ =
           modRMTable[(int)((uint)*(ushort *)(indextable + 2) + (modRM & 0x3f) + 8)];
    }
    else {
      insnContext_local._2_2_ =
           modRMTable[(int)((uint)*(ushort *)(indextable + 2) + ((int)(modRM & 0x38) >> 3))];
    }
    break;
  case '\x03':
    if ((int)(modRM & 0xc0) >> 6 == 3) {
      insnContext_local._2_2_ =
           modRMTable[(int)((uint)*(ushort *)(indextable + 2) + ((int)(modRM & 0x38) >> 3) + 8)];
    }
    else {
      insnContext_local._2_2_ =
           modRMTable[(int)((uint)*(ushort *)(indextable + 2) + ((int)(modRM & 0x38) >> 3))];
    }
    break;
  case '\x04':
    insnContext_local._2_2_ = modRMTable[(int)((uint)*(ushort *)(indextable + 2) + (uint)modRM)];
    break;
  default:
    insnContext_local._2_2_ = IC >> 0x10;
  }
  return insnContext_local._2_2_;
}

Assistant:

static InstrUID decode(OpcodeType type,
		InstructionContext insnContext,
		uint8_t opcode,
		uint8_t modRM)
{
	const struct ModRMDecision *dec = NULL;
	const uint8_t *indextable = NULL;
	uint8_t index;

	switch (type) {
		default:
		case ONEBYTE:
			indextable = index_x86DisassemblerOneByteOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &ONEBYTE_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case TWOBYTE:
			indextable = index_x86DisassemblerTwoByteOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &TWOBYTE_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case THREEBYTE_38:
			indextable = index_x86DisassemblerThreeByte38Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &THREEBYTE38_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case THREEBYTE_3A:
			indextable = index_x86DisassemblerThreeByte3AOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &THREEBYTE3A_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
#ifndef CAPSTONE_X86_REDUCE
		case XOP8_MAP:
			indextable = index_x86DisassemblerXOP8Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOP8_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case XOP9_MAP:
			indextable = index_x86DisassemblerXOP9Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOP9_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case XOPA_MAP:
			indextable = index_x86DisassemblerXOPAOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOPA_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case T3DNOW_MAP:
			indextable = index_x86DisassemblerT3DNOWOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &T3DNOW_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
#endif
	}

	switch (dec->modrm_type) {
		default:
			//debug("Corrupt table!  Unknown modrm_type");
			return 0;
		case MODRM_ONEENTRY:
			return modRMTable[dec->instructionIDs];
		case MODRM_SPLITRM:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+1];
			return modRMTable[dec->instructionIDs];
		case MODRM_SPLITREG:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)+8];
			return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)];
		case MODRM_SPLITMISC:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+(modRM & 0x3f)+8];
			return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)];
		case MODRM_FULL:
			return modRMTable[dec->instructionIDs+modRM];
	}
}